

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixView<double> *outJacobian)

{
  uint uVar1;
  index_type iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *pDVar7;
  ScalarWithConstIfNotLvalue *pSVar8;
  MatrixView<double> *in_RCX;
  int iVar9;
  long in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  size_t r;
  size_t c;
  SpatialMotionVector column;
  int i;
  size_t dofOffset;
  IJointConstPtr joint;
  LinkIndex parentLinkIdx;
  Matrix6x6 genericAdjointTransform;
  LinkIndex visitedLinkIdx;
  Traversal *relativeTraversal;
  LinkIndex refJacobianLink;
  LinkIndex jacobianLinkIndex;
  bool ok;
  DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
  *in_stack_fffffffffffffa68;
  EigenBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>_>
  *in_stack_fffffffffffffa70;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  SpatialVector<iDynTree::SpatialMotionVector> *this_00;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  uint uVar10;
  MatrixFixSize<6U,_6U> *in_stack_fffffffffffffa90;
  MatrixView<double> *this_01;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 uVar11;
  SpatialMotionVector *in_stack_fffffffffffffaf8;
  undefined1 local_498 [216];
  EigenBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>_>
  *local_3c0;
  SpatialVector<iDynTree::SpatialMotionVector> *local_2e0;
  SpatialVector<iDynTree::SpatialMotionVector> local_2d8;
  uint local_2a4;
  undefined8 local_2a0;
  long *local_298;
  long local_290;
  MatrixFixSize<6U,_6U> local_198;
  long local_78;
  long local_70;
  undefined8 local_68;
  long local_60;
  undefined1 local_29;
  bool local_1;
  
  this_01 = in_RCX;
  iVar2 = MatrixView<double>::rows(in_RCX);
  uVar11 = false;
  if (iVar2 == 6) {
    iVar2 = MatrixView<double>::cols(this_01);
    lVar3 = iDynTree::Model::getNrOfDOFs();
    uVar11 = iVar2 == lVar3;
  }
  local_29 = uVar11;
  if ((bool)uVar11 == false) {
    iDynTree::reportError
              ("KinDynComputations","getRelativeJacobianSparsityPattern",
               "Wrong size in input outJacobian");
    local_1 = false;
  }
  else {
    uVar4 = iDynTree::Model::isValidFrameIndex(*(long *)(in_RDI + 8) + 8);
    if ((uVar4 & 1) == 0) {
      iDynTree::reportError("KinDynComputations","getRelativeJacobian","Frame index out of bounds");
      local_1 = false;
    }
    else {
      uVar4 = iDynTree::Model::isValidFrameIndex(*(long *)(in_RDI + 8) + 8);
      if ((uVar4 & 1) == 0) {
        iDynTree::reportError
                  ("KinDynComputations","getRelativeJacobian","Reference frame index out of bounds")
        ;
        local_1 = false;
      }
      else {
        toEigen((MatrixView<double> *)CONCAT17(uVar11,in_stack_fffffffffffffab8));
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
        ::setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                   *)in_stack_fffffffffffffa70);
        local_60 = iDynTree::Model::getFrameLink(*(long *)(in_RDI + 8) + 8);
        local_68 = iDynTree::Model::getFrameLink(*(long *)(in_RDI + 8) + 8);
        local_70 = iDynTree::LinkTraversalsCache::getTraversalWithLinkAsBase
                             ((Model *)(*(long *)(in_RDI + 8) + 0x198),*(long *)(in_RDI + 8) + 8);
        local_78 = local_60;
        MatrixFixSize<6U,_6U>::MatrixFixSize(&local_198);
        MatrixFixSize<6U,_6U>::zero(in_stack_fffffffffffffa90);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
        topLeftCorner<int,int>
                  ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                   (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),(int)in_stack_fffffffffffffa80);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
        ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                   *)in_stack_fffffffffffffa70);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
        topRightCorner<int,int>
                  ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)this_01,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
        ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                   *)in_stack_fffffffffffffa70);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
        bottomRightCorner<int,int>
                  ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)CONCAT17(uVar11,in_stack_fffffffffffffab8),(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
        ::setOnes((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                   *)in_stack_fffffffffffffa70);
        while( true ) {
          lVar3 = local_78;
          iDynTree::Traversal::getBaseLink();
          lVar5 = iDynTree::Link::getIndex();
          if (lVar3 == lVar5) break;
          iDynTree::Traversal::getParentLinkFromLinkIndex(local_70);
          local_290 = iDynTree::Link::getIndex();
          local_298 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex(local_70);
          local_2a0 = (**(code **)(*local_298 + 0xc0))();
          local_2a4 = 0;
          while( true ) {
            uVar10 = local_2a4;
            uVar1 = (**(code **)(*local_298 + 0x20))();
            if (uVar1 <= uVar10) break;
            (**(code **)(*local_298 + 0x60))(&local_2d8,local_298,local_2a4,local_78,local_290);
            local_2e0 = (SpatialVector<iDynTree::SpatialMotionVector> *)0x0;
            while( true ) {
              this_00 = local_2e0;
              uVar1 = SpatialVector<iDynTree::SpatialMotionVector>::size(&local_2d8);
              if ((SpatialVector<iDynTree::SpatialMotionVector> *)(ulong)uVar1 <= this_00) break;
              iVar9 = (int)&local_2d8;
              SpatialVector<iDynTree::SpatialMotionVector>::operator()
                        (this_00,(uint)((ulong)in_stack_fffffffffffffa78 >> 0x20));
              std::abs(iVar9);
              in_stack_fffffffffffffa78 =
                   (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
                    *)(~-(ulong)(extraout_XMM0_Qa < DEFAULT_TOL) & 0x3ff0000000000000);
              pdVar6 = SpatialVector<iDynTree::SpatialMotionVector>::operator()
                                 (this_00,(uint)((ulong)in_stack_fffffffffffffa78 >> 0x20));
              *pdVar6 = (double)in_stack_fffffffffffffa78;
              local_2e0 = (SpatialVector<iDynTree::SpatialMotionVector> *)
                          ((long)(local_2e0->linearVec3).super_Vector3.m_data + 1);
            }
            toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)CONCAT44(uVar10,in_stack_fffffffffffffa88));
            toEigen(in_stack_fffffffffffffaf8);
            Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
            operator*((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                       *)CONCAT44(uVar10,in_stack_fffffffffffffa88),
                      (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this_00);
            toEigen((MatrixView<double> *)CONCAT17(uVar11,in_stack_fffffffffffffab8));
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
            ::col(in_stack_fffffffffffffa78,(Index)in_stack_fffffffffffffa70);
            Eigen::
            Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>,-1,1,false>
            ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>
                         *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
            local_3c0 = (EigenBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>_>
                         *)0x0;
            while( true ) {
              in_stack_fffffffffffffa70 = local_3c0;
              toEigen((MatrixView<double> *)CONCAT17(uVar11,in_stack_fffffffffffffab8));
              Eigen::
              DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
              ::col(in_stack_fffffffffffffa78,(Index)in_stack_fffffffffffffa70);
              pDVar7 = (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                        *)Eigen::
                          EigenBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_-1,_1,_false>_>
                          ::size(in_stack_fffffffffffffa70);
              if (pDVar7 <= in_stack_fffffffffffffa70) break;
              toEigen((MatrixView<double> *)CONCAT17(uVar11,in_stack_fffffffffffffab8));
              Eigen::
              DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
              ::col(in_stack_fffffffffffffa78,(Index)in_stack_fffffffffffffa70);
              iVar9 = (int)local_498;
              Eigen::
              MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_-1,_1,_false>,_1>
              ::coeffRef((MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
                          *)this_00,(Index)in_stack_fffffffffffffa78);
              std::abs(iVar9);
              in_stack_fffffffffffffa68 =
                   (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)(~-(ulong)(extraout_XMM0_Qa_00 < DEFAULT_TOL) & 0x3ff0000000000000);
              toEigen((MatrixView<double> *)CONCAT17(uVar11,in_stack_fffffffffffffab8));
              Eigen::
              DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>_>
              ::col(in_stack_fffffffffffffa78,(Index)in_stack_fffffffffffffa70);
              pSVar8 = Eigen::
                       MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<-1,_-1>_>,_-1,_1,_false>,_1>
                       ::coeffRef((MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,__1,_1,_false>,_1>
                                   *)this_00,(Index)in_stack_fffffffffffffa78);
              *pSVar8 = (ScalarWithConstIfNotLvalue)in_stack_fffffffffffffa68;
              local_3c0 = local_3c0 + 1;
            }
            local_2a4 = local_2a4 + 1;
          }
          local_78 = local_290;
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            MatrixView<double> outJacobian) const
    {
        bool ok = (outJacobian.rows() == 6)
            && (outJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs());

        if( !ok )
        {
            reportError("KinDynComputations","getRelativeJacobianSparsityPattern","Wrong size in input outJacobian");
            return false;
        }

        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Frame index out of bounds");
            return false;
        }
        if (!pimpl->m_robot_model.isValidFrameIndex(refFrameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Reference frame index out of bounds");
            return false;
        }

        // clear the matrix
        toEigen(outJacobian).setZero();

        // This method computes the sparsity pattern of the relative Jacobian.
        // For details on how to compute the relative Jacobian, see Traversaro's PhD thesis, 3.37
        // or getRelativeJacobianExplicit method.
        // Here we simply implement the same code, but trying to obtain only 1 and zeros.

        // Get the links to which the frames are attached
        LinkIndex jacobianLinkIndex = pimpl->m_robot_model.getFrameLink(frameIndex);
        LinkIndex refJacobianLink = pimpl->m_robot_model.getFrameLink(refFrameIndex);

        iDynTree::Traversal& relativeTraversal = pimpl->m_traversalCache.getTraversalWithLinkAsBase(pimpl->m_robot_model, refJacobianLink);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobianLinkIndex;

        // Generic adjoint transform matrix (6x6).
        // Rotations are filled with 1.
        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();


        while (visitedLinkIdx != relativeTraversal.getBaseLink()->getIndex())
        {
            //get the pair of links in the traversal
            LinkIndex parentLinkIdx = relativeTraversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = relativeTraversal.getParentJointFromLinkIndex(visitedLinkIdx);

            //Now for each Dof get the motion subspace
            //{}^F s_{E,F}, i.e. the velocity of F wrt E written in F.
            size_t dofOffset = joint->getDOFsOffset();
            for (int i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                // This is actually where we specify the pattern
                SpatialMotionVector column = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                for (size_t c = 0; c < column.size(); ++c) {
                    column(c) = std::abs(column(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobian).col(dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(column);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobian).col(dofOffset + i).size(); ++r) {
                    toEigen(outJacobian).col(dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobian).col(dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }

            }

            visitedLinkIdx = parentLinkIdx;
        }
        return true;
    }